

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O1

mz_bool mz_zip_reader_is_file_supported(mz_zip_archive *pZip,mz_uint file_index)

{
  ushort uVar1;
  mz_zip_internal_state *pmVar2;
  uint uVar3;
  long lVar4;
  mz_zip_error mVar5;
  
  if (((pZip == (mz_zip_archive *)0x0) ||
      (pmVar2 = pZip->m_pState, pmVar2 == (mz_zip_internal_state *)0x0)) ||
     (pZip->m_total_files <= file_index)) {
    lVar4 = 0;
  }
  else {
    lVar4 = (ulong)*(uint *)((long)(pmVar2->m_central_dir_offsets).m_p + (ulong)file_index * 4) +
            (long)(pmVar2->m_central_dir).m_p;
  }
  if (lVar4 == 0) {
    mVar5 = MZ_ZIP_INVALID_PARAMETER;
  }
  else if ((*(ushort *)(lVar4 + 10) & 0xfff7) == 0) {
    uVar1 = *(ushort *)(lVar4 + 8);
    if ((uVar1 & 0x41) == 0) {
      uVar3 = (uVar1 & 0x20) >> 5 ^ 1;
      if (pZip == (mz_zip_archive *)0x0) {
        return uVar3;
      }
      mVar5 = MZ_ZIP_UNSUPPORTED_FEATURE;
      if ((uVar1 & 0x20) == 0) {
        return uVar3;
      }
      goto LAB_002663c0;
    }
    mVar5 = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
  }
  else {
    mVar5 = MZ_ZIP_UNSUPPORTED_METHOD;
  }
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
LAB_002663c0:
  pZip->m_last_error = mVar5;
  return 0;
}

Assistant:

mz_bool mz_zip_reader_is_file_supported(mz_zip_archive *pZip, mz_uint file_index)
{
    mz_uint bit_flag;
    mz_uint method;

    const mz_uint8 *p = mz_zip_get_cdh(pZip, file_index);
    if (!p)
    {
        mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);
        return MZ_FALSE;
    }

    method = MZ_READ_LE16(p + MZ_ZIP_CDH_METHOD_OFS);
    bit_flag = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);

    if ((method != 0) && (method != MZ_DEFLATED))
    {
        mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_METHOD);
        return MZ_FALSE;
    }

    if (bit_flag & (MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_IS_ENCRYPTED | MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_USES_STRONG_ENCRYPTION))
    {
        mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);
        return MZ_FALSE;
    }

    if (bit_flag & MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_COMPRESSED_PATCH_FLAG)
    {
        mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_FEATURE);
        return MZ_FALSE;
    }

    return MZ_TRUE;
}